

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O3

Type * __thiscall
spvtools::opt::analysis::TypeManager::GetMemberType
          (TypeManager *this,Type *parent_type,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *access_chain)

{
  uint uVar1;
  uint *puVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined8 *puVar5;
  uint *puVar6;
  undefined4 extraout_var_00;
  
  puVar6 = (access_chain->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (access_chain->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (puVar6 == puVar2) {
      return parent_type;
    }
    uVar1 = *puVar6;
    iVar3 = (*parent_type->_vptr_Type[0x1e])(parent_type);
    if (CONCAT44(extraout_var,iVar3) == 0) {
      iVar3 = (*parent_type->_vptr_Type[0x18])(parent_type);
      lVar4 = CONCAT44(extraout_var_00,iVar3);
      if (lVar4 == 0) {
        iVar3 = (*parent_type->_vptr_Type[0x1a])(parent_type);
        lVar4 = CONCAT44(extraout_var_01,iVar3);
        if (lVar4 == 0) {
          iVar3 = (*parent_type->_vptr_Type[0xe])(parent_type);
          lVar4 = CONCAT44(extraout_var_02,iVar3);
          if (lVar4 == 0) {
            iVar3 = (*parent_type->_vptr_Type[0x10])(parent_type);
            lVar4 = CONCAT44(extraout_var_03,iVar3);
            if (lVar4 == 0) {
              __assert_fail("false && \"Trying to get a member of a type without members.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                            ,0x43e,
                            "const Type *spvtools::opt::analysis::TypeManager::GetMemberType(const Type *, const std::vector<uint32_t> &)"
                           );
            }
          }
        }
      }
      puVar5 = (undefined8 *)(lVar4 + 0x28);
    }
    else {
      puVar5 = (undefined8 *)((ulong)uVar1 * 8 + *(long *)(CONCAT44(extraout_var,iVar3) + 0x28));
    }
    parent_type = (Type *)*puVar5;
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

const Type* TypeManager::GetMemberType(
    const Type* parent_type, const std::vector<uint32_t>& access_chain) {
  for (uint32_t element_index : access_chain) {
    if (const Struct* struct_type = parent_type->AsStruct()) {
      parent_type = struct_type->element_types()[element_index];
    } else if (const Array* array_type = parent_type->AsArray()) {
      parent_type = array_type->element_type();
    } else if (const RuntimeArray* runtime_array_type =
                   parent_type->AsRuntimeArray()) {
      parent_type = runtime_array_type->element_type();
    } else if (const Vector* vector_type = parent_type->AsVector()) {
      parent_type = vector_type->element_type();
    } else if (const Matrix* matrix_type = parent_type->AsMatrix()) {
      parent_type = matrix_type->element_type();
    } else {
      assert(false && "Trying to get a member of a type without members.");
    }
  }
  return parent_type;
}